

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O1

void __thiscall cmCTestBZR::LogParser::EndElement(LogParser *this,string *name)

{
  bool bVar1;
  int iVar2;
  pointer pcVar3;
  char *pcVar4;
  Revision *pRVar5;
  string *psVar6;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28;
  undefined7 uStack_27;
  
  iVar2 = std::__cxx11::string::compare((char *)name);
  if (iVar2 == 0) {
    (*(this->BZR->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[9])
              (this->BZR,&this->Rev,&this->Changes);
    goto LAB_002d1ec4;
  }
  if ((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    iVar2 = std::__cxx11::string::compare((char *)name);
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)name);
      if (iVar2 != 0) goto LAB_002d1cc0;
    }
    pcVar4 = (char *)(this->CurChange).Path._M_string_length;
    pcVar3 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
LAB_002d1dff:
    psVar6 = &(this->CurChange).Path;
    std::__cxx11::string::_M_replace((ulong)psVar6,0,pcVar4,(ulong)pcVar3);
    cmsys::SystemTools::ConvertToUnixSlashes(psVar6);
    std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::push_back
              (&this->Changes,&this->CurChange);
    goto LAB_002d1ec4;
  }
LAB_002d1cc0:
  if ((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    iVar2 = std::__cxx11::string::compare((char *)name);
    if (iVar2 == 0) {
      pcVar4 = (char *)(this->CurChange).Path._M_string_length;
      pcVar3 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      goto LAB_002d1dff;
    }
  }
  if ((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    iVar2 = std::__cxx11::string::compare((char *)name);
    if (iVar2 == 0) {
      psVar6 = &(this->Rev).Author;
      std::__cxx11::string::_M_replace
                ((ulong)psVar6,0,(char *)(this->Rev).Author._M_string_length,
                 (ulong)(this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      bVar1 = cmsys::RegularExpression::find
                        (&this->EmailRegex,(this->Rev).Author._M_dataplus._M_p,
                         &(this->EmailRegex).regmatch);
      if (bVar1) {
        pcVar4 = (this->EmailRegex).regmatch.startp[1];
        if (pcVar4 == (char *)0x0) {
          local_38 = &local_28;
          local_30 = 0;
          local_28 = 0;
        }
        else {
          local_38 = &local_28;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_38,pcVar4,(this->EmailRegex).regmatch.endp[1]);
        }
        std::__cxx11::string::operator=((string *)psVar6,(string *)&local_38);
        if (local_38 != &local_28) {
          operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
        }
        pcVar4 = (this->EmailRegex).regmatch.startp[2];
        local_38 = &local_28;
        if (pcVar4 == (char *)0x0) {
          local_30 = 0;
          local_28 = 0;
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_38,pcVar4,(this->EmailRegex).regmatch.endp[2]);
        }
        std::__cxx11::string::operator=((string *)&(this->Rev).EMail,(string *)&local_38);
        if (local_38 != &local_28) {
          operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
        }
      }
      goto LAB_002d1ec4;
    }
  }
  if ((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
LAB_002d1d35:
    if ((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      iVar2 = std::__cxx11::string::compare((char *)name);
      if (iVar2 == 0) {
        pRVar5 = (Revision *)&(this->Rev).Log;
        pcVar4 = (char *)(this->Rev).Log._M_string_length;
        goto LAB_002d1eac;
      }
    }
    if ((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_002d1ec4;
    iVar2 = std::__cxx11::string::compare((char *)name);
    if (iVar2 != 0) goto LAB_002d1ec4;
    pRVar5 = &this->Rev;
    pcVar4 = (char *)(this->Rev).Rev._M_string_length;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)name);
    if (iVar2 != 0) goto LAB_002d1d35;
    pRVar5 = (Revision *)&(this->Rev).Date;
    pcVar4 = (char *)(this->Rev).Date._M_string_length;
  }
LAB_002d1eac:
  std::__cxx11::string::_M_replace
            ((ulong)pRVar5,0,pcVar4,
             (ulong)(this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
LAB_002d1ec4:
  pcVar3 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish != pcVar3) {
    (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar3;
  }
  return;
}

Assistant:

void EndElement(const std::string& name) override
  {
    if (name == "log") {
      this->BZR->DoRevision(this->Rev, this->Changes);
    } else if (!this->CData.empty() &&
               (name == "file" || name == "directory")) {
      this->CurChange.Path.assign(this->CData.data(), this->CData.size());
      cmSystemTools::ConvertToUnixSlashes(this->CurChange.Path);
      this->Changes.push_back(this->CurChange);
    } else if (!this->CData.empty() && name == "symlink") {
      // symlinks have an arobase at the end in the log
      this->CurChange.Path.assign(this->CData.data(), this->CData.size() - 1);
      cmSystemTools::ConvertToUnixSlashes(this->CurChange.Path);
      this->Changes.push_back(this->CurChange);
    } else if (!this->CData.empty() && name == "committer") {
      this->Rev.Author.assign(this->CData.data(), this->CData.size());
      if (this->EmailRegex.find(this->Rev.Author)) {
        this->Rev.Author = this->EmailRegex.match(1);
        this->Rev.EMail = this->EmailRegex.match(2);
      }
    } else if (!this->CData.empty() && name == "timestamp") {
      this->Rev.Date.assign(this->CData.data(), this->CData.size());
    } else if (!this->CData.empty() && name == "message") {
      this->Rev.Log.assign(this->CData.data(), this->CData.size());
    } else if (!this->CData.empty() && name == "revno") {
      this->Rev.Rev.assign(this->CData.data(), this->CData.size());
    }
    this->CData.clear();
  }